

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_gen_image_gradient_v_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,rf_color top,rf_color bottom,
          rf_color *dst,rf_int dst_size)

{
  int iVar1;
  float fVar2;
  undefined4 uStack_3c;
  long local_38;
  rf_int i;
  long lStack_28;
  float factor;
  rf_int j;
  rf_color *dst_local;
  int height_local;
  int width_local;
  rf_color bottom_local;
  rf_color top_local;
  
  memset(__return_storage_ptr__,0,0x18);
  iVar1 = rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
  if (width * height * iVar1 <= dst_size) {
    for (lStack_28 = 0; lStack_28 < height; lStack_28 = lStack_28 + 1) {
      fVar2 = (float)lStack_28 / (float)height;
      for (local_38 = 0; local_38 < width; local_38 = local_38 + 1) {
        dst[lStack_28 * width + local_38].r =
             (uchar)(int)((float)((uint)bottom & 0xff) * fVar2 +
                         (float)((uint)top & 0xff) * (1.0 - fVar2));
        dst[lStack_28 * width + local_38].g =
             (uchar)(int)((float)((uint)bottom >> 8 & 0xff) * fVar2 +
                         (float)((uint)top >> 8 & 0xff) * (1.0 - fVar2));
        dst[lStack_28 * width + local_38].b =
             (uchar)(int)((float)((uint)bottom >> 0x10 & 0xff) * fVar2 +
                         (float)((uint)top >> 0x10 & 0xff) * (1.0 - fVar2));
        dst[lStack_28 * width + local_38].a =
             (uchar)(int)((float)((uint)bottom >> 0x18) * fVar2 +
                         (float)((uint)top >> 0x18) * (1.0 - fVar2));
      }
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = 7;
    __return_storage_ptr__->valid = true;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = uStack_3c._1_3_;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_gradient_v_to_buffer(int width, int height, rf_color top, rf_color bottom, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        for (rf_int j = 0; j < height; j++)
        {
            float factor = ((float)j) / ((float)height);

            for (rf_int i = 0; i < width; i++)
            {
                ((rf_color*)dst)[j * width + i].r = (int)((float)bottom.r * factor + (float)top.r * (1.f - factor));
                ((rf_color*)dst)[j * width + i].g = (int)((float)bottom.g * factor + (float)top.g * (1.f - factor));
                ((rf_color*)dst)[j * width + i].b = (int)((float)bottom.b * factor + (float)top.b * (1.f - factor));
                ((rf_color*)dst)[j * width + i].a = (int)((float)bottom.a * factor + (float)top.a * (1.f - factor));
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true
        };
    }

    return result;
}